

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  ImGuiInputTextState *in_RDI;
  int in_stack_000000c4;
  STB_TexteditState *in_stack_000000c8;
  ImGuiInputTextState *in_stack_000000d0;
  
  ImStb::stb_textedit_key(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
  in_RDI->CursorFollow = true;
  CursorAnimReset(in_RDI);
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}